

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloat.hpp
# Opt level: O1

Float<unsigned_int,_5,_6,_15,_2U>
tcu::Float<unsigned_int,5,6,15,2u>::convert<unsigned_long,11,52,1023,3u>
          (Float<unsigned_long,_11,_52,_1023,_3U> *other)

{
  long lVar1;
  StorageType SVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar5 = other->m_value;
  if ((long)uVar5 < 0) {
    return (Float<unsigned_int,_5,_6,_15,_2U>)0;
  }
  SVar2 = 0x7c0;
  if (uVar5 != 0x7ff0000000000000) {
    uVar6 = uVar5 & 0xfffffffffffff;
    SVar2 = 0x7ff;
    if ((uVar5 & 0x7ff0000000000000) != 0x7ff0000000000000 || uVar6 == 0) {
      if (uVar5 == 0) {
        return (Float<unsigned_int,_5,_6,_15,_2U>)0;
      }
      uVar4 = (uint)(uVar5 >> 0x20);
      iVar3 = (uVar4 >> 0x14) - 0x3ff;
      uVar7 = uVar6 | 0x10000000000000;
      if ((uVar5 & 0x7ff0000000000000) == 0 && uVar6 != 0) {
        lVar1 = 0x3f;
        if (uVar6 != 0) {
          for (; uVar6 >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        uVar7 = uVar6 << (~(byte)lVar1 + 0x35 & 0x3f);
        iVar3 = -0x3f3 - ((uint)lVar1 ^ 0x3f);
      }
      if (-0xf < iVar3) {
        uVar5 = (uVar7 & 0xffefffffffffffff) + 0x1fffffffffff + (ulong)((uVar7 >> 0x2e & 1) != 0);
        uVar6 = uVar5 & 0x10000000000000;
        iVar3 = iVar3 + (uint)(uVar6 >> 0x34);
        if (iVar3 < 0x10) {
          uVar4 = (uint)(uVar5 >> 0x2e);
          if (uVar6 != 0) {
            uVar4 = 0;
          }
          return (Float<unsigned_int,_5,_6,_15,_2U>)(uVar4 | iVar3 * 0x40 + 0x3c0U);
        }
        return (Float<unsigned_int,_5,_6,_15,_2U>)((uVar4 >> 0x1f) << 0xb | 0x7c0);
      }
      SVar2 = 0;
      if (-0x16 < iVar3) {
        SVar2 = (StorageType)
                (~(-1L << (0x1fU - (char)iVar3 & 0x3f)) + uVar7 +
                 (ulong)((uVar7 >> ((ulong)(0x20U - iVar3) & 0x3f) & 1) != 0) >>
                ((byte)(0x20U - iVar3) & 0x3f));
      }
    }
  }
  return (Float<unsigned_int,_5,_6,_15,_2U>)SVar2;
}

Assistant:

inline int				signBit			(void) const	{ return (int)(m_value >> (ExponentBits+MantissaBits)) & 1;					}